

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::destroy
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this)

{
  AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this_local;
  
  freePromise<kj::_::AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }